

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O3

xmlChar * readerStrdup(xmlTextReaderPtr reader,xmlChar *string)

{
  xmlChar *pxVar1;
  
  if (string != (xmlChar *)0x0) {
    pxVar1 = xmlStrdup(string);
    if (pxVar1 == (xmlChar *)0x0) {
      xmlTextReaderErrMemory(reader);
      pxVar1 = (xmlChar *)0x0;
    }
    return pxVar1;
  }
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar *
readerStrdup(xmlTextReaderPtr reader, const xmlChar *string) {
    xmlChar *copy;

    if (string == NULL)
        return(NULL);

    copy = xmlStrdup(string);
    if (copy == NULL)
        xmlTextReaderErrMemory(reader);

    return(copy);
}